

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

bool crunch::progress_callback_func(uint32 percentage_complete,void *param_2)

{
  console *in_RDI;
  console *this;
  uint32 i_3;
  uint32 i_2;
  uint32 i_1;
  uint32 i;
  char buf [8];
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  console local_18 [7];
  undefined1 local_11;
  uint local_4;
  
  local_4 = (uint)in_RDI;
  crnlib::console::disable_crlf(in_RDI);
  for (local_1c = 0; local_1c < 7; local_1c = local_1c + 1) {
    local_18[local_1c] = (console)0x8;
  }
  local_11 = 0;
  for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
    crnlib::console::progress((char *)local_18);
  }
  crnlib::console::progress("Processing: %u%%",(ulong)local_4);
  for (local_24 = 0; local_24 < 7; local_24 = local_24 + 1) {
    local_18[local_24] = (console)0x20;
  }
  crnlib::console::progress((char *)local_18);
  crnlib::console::progress((char *)local_18);
  for (local_28 = 0; local_28 < 7; local_28 = local_28 + 1) {
    local_18[local_28] = (console)0x8;
  }
  crnlib::console::progress((char *)local_18);
  this = local_18;
  crnlib::console::progress();
  crnlib::console::enable_crlf(this);
  return true;
}

Assistant:

static bool progress_callback_func(uint32 percentage_complete, void* /* pUser_data_ptr */) {
    console::disable_crlf();

    char buf[8];
    for (uint32 i = 0; i < 7; i++)
      buf[i] = 8;
    buf[7] = '\0';

    for (uint32 i = 0; i < 130 / 8; i++)
      console::progress(buf);

    console::progress("Processing: %u%%", percentage_complete);

    for (uint32 i = 0; i < 7; i++)
      buf[i] = ' ';
    console::progress(buf);
    console::progress(buf);

    for (uint32 i = 0; i < 7; i++)
      buf[i] = 8;
    console::progress(buf);
    console::progress(buf);

    console::enable_crlf();

    return true;
  }